

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O1

void __thiscall
t_java_generator::generate_java_meta_data_map(t_java_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  t_field *ptVar2;
  pointer pcVar3;
  ostream *poVar4;
  long lVar5;
  t_java_generator *this_00;
  char *pcVar6;
  pointer pptVar7;
  string field_name;
  undefined1 local_90 [32];
  string local_70;
  string local_50;
  
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "public static final java.util.Map<_Fields, org.apache.thrift.meta_data.FieldMetaData> metaDataMap;"
             ,0x62);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"static {",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "java.util.Map<_Fields, org.apache.thrift.meta_data.FieldMetaData> tmpMap = new java.util.EnumMap<_Fields, org.apache.thrift.meta_data.FieldMetaData>(_Fields.class);"
             ,0xa4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  pptVar7 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar7 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      ptVar2 = *pptVar7;
      pcVar3 = (ptVar2->name_)._M_dataplus._M_p;
      local_90._0_8_ = (t_java_generator *)(local_90 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,pcVar3,pcVar3 + (ptVar2->name_)._M_string_length);
      poVar4 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"tmpMap.put(_Fields.",0x13);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      this_00 = (t_java_generator *)local_90._0_8_;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_90._0_8_,(pointer)(local_90._0_8_ + local_90._8_8_));
      constant_name(&local_50,this_00,&local_70);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_50._M_dataplus._M_p,local_50._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,", new org.apache.thrift.meta_data.FieldMetaData(\"",0x31);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)local_90._0_8_,local_90._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\", ",3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      lVar5 = 0x32;
      if (ptVar2->req_ == T_OPTIONAL) {
        pcVar6 = "org.apache.thrift.TFieldRequirementType.OPTIONAL, ";
      }
      else if (ptVar2->req_ == T_REQUIRED) {
        pcVar6 = "org.apache.thrift.TFieldRequirementType.REQUIRED, ";
      }
      else {
        lVar5 = 0x31;
        pcVar6 = "org.apache.thrift.TFieldRequirementType.DEFAULT, ";
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,pcVar6,lVar5);
      generate_field_value_meta_data(this,out,ptVar2->type_);
      std::__ostream_insert<char,std::char_traits<char>>(out,"));",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((t_java_generator *)local_90._0_8_ != (t_java_generator *)(local_90 + 0x10)) {
        operator_delete((void *)local_90._0_8_);
      }
      pptVar7 = pptVar7 + 1;
    } while (pptVar7 !=
             (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"metaDataMap = java.util.Collections.unmodifiableMap(tmpMap);",0x3c);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"org.apache.thrift.meta_data.FieldMetaData.addStructMetaDataMap(",0x3f);
  type_name_abi_cxx11_((string *)local_90,this,&tstruct->super_t_type,false,false,false,false);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(char *)local_90._0_8_,local_90._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,".class, metaDataMap);",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((t_java_generator *)local_90._0_8_ != (t_java_generator *)(local_90 + 0x10)) {
    operator_delete((void *)local_90._0_8_);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_java_generator::generate_java_meta_data_map(ostream& out, t_struct* tstruct) {
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  // Static Map with fieldID -> org.apache.thrift.meta_data.FieldMetaData mappings
  indent(out)
      << "public static final java.util.Map<_Fields, org.apache.thrift.meta_data.FieldMetaData> metaDataMap;"
      << endl;
  indent(out) << "static {" << endl;
  indent_up();

  indent(out) << "java.util.Map<_Fields, org.apache.thrift.meta_data.FieldMetaData> tmpMap = new "
                 "java.util.EnumMap<_Fields, org.apache.thrift.meta_data.FieldMetaData>(_Fields.class);"
              << endl;

  // Populate map
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    t_field* field = *f_iter;
    std::string field_name = field->get_name();
    indent(out) << "tmpMap.put(_Fields." << constant_name(field_name)
                << ", new org.apache.thrift.meta_data.FieldMetaData(\"" << field_name << "\", ";

    // Set field requirement type (required, optional, etc.)
    if (field->get_req() == t_field::T_REQUIRED) {
      out << "org.apache.thrift.TFieldRequirementType.REQUIRED, ";
    } else if (field->get_req() == t_field::T_OPTIONAL) {
      out << "org.apache.thrift.TFieldRequirementType.OPTIONAL, ";
    } else {
      out << "org.apache.thrift.TFieldRequirementType.DEFAULT, ";
    }

    // Create value meta data
    generate_field_value_meta_data(out, field->get_type());
    out << "));" << endl;
  }

  indent(out) << "metaDataMap = java.util.Collections.unmodifiableMap(tmpMap);" << endl;

  indent(out) << "org.apache.thrift.meta_data.FieldMetaData.addStructMetaDataMap("
              << type_name(tstruct) << ".class, metaDataMap);" << endl;
  indent_down();
  indent(out) << "}" << endl << endl;
}